

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
pbrt::GBufferFilm::AddSplat
          (GBufferFilm *this,Point2f *p,SampledSpectrum v,SampledWavelengths *lambda)

{
  AtomicDouble *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  PixelSensor *this_00;
  Pixel *pPVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  double dVar10;
  long lVar11;
  GaussianFilter *this_01;
  MitchellFilter *this_02;
  uint uVar12;
  ulong uVar13;
  undefined8 unaff_R15;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  Float FVar19;
  undefined1 auVar20 [56];
  undefined1 auVar22 [60];
  undefined1 auVar21 [64];
  float fVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  RGB RVar37;
  SampledSpectrum H;
  Tuple2<pbrt::Point2,_float> local_b8;
  float local_b0;
  uint local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [4];
  float afStack_54 [5];
  SampledSpectrum local_40;
  
  auVar21._8_56_ = v._16_56_;
  auVar21._0_8_ = v.values.values._8_8_;
  auVar36._8_56_ = v._8_56_;
  auVar36._0_8_ = v.values.values._0_8_;
  _local_58 = vmovlhps_avx(auVar36._0_16_,auVar21._0_16_);
  auVar22 = ZEXT1260(local_58._4_12_);
  if (!NAN(v.values.values[0])) {
    uVar9 = 0xffffffffffffffff;
    do {
      if (uVar9 == 2) goto LAB_003a2287;
      lVar11 = uVar9 * 4;
      uVar9 = uVar9 + 1;
    } while (!NAN(*(float *)(local_58 + lVar11 + 8)) && !NAN(*(float *)(local_58 + lVar11 + 8)));
    if (2 < uVar9) {
LAB_003a2287:
      this_00 = (this->super_FilmBase).sensor;
      fVar18 = this_00->imagingRatio;
      local_40.values.values[0] = fVar18 * (float)local_58;
      local_40.values.values[1] = fVar18 * afStack_54[0];
      local_40.values.values[2] = fVar18 * afStack_54[1];
      local_40.values.values[3] = fVar18 * afStack_54[2];
      auVar20 = ZEXT856(local_40.values.values._8_8_);
      RVar37 = PixelSensor::ToSensorRGB(this_00,&local_40,lambda);
      auVar35._0_4_ = RVar37.b;
      auVar35._4_60_ = auVar22;
      auVar31._0_8_ = RVar37._0_8_;
      auVar31._8_56_ = auVar20;
      fVar18 = this->maxComponentValue;
      local_78 = auVar31._0_16_;
      auVar17 = vmovshdup_avx(local_78);
      auVar17 = vmaxss_avx(auVar17,local_78);
      auVar17 = vmaxss_avx(auVar35._0_16_,auVar17);
      fVar23 = fVar18 / auVar17._0_4_;
      if (fVar18 < auVar17._0_4_) {
        local_78._0_4_ = RVar37.r * fVar23;
        local_78._4_4_ = RVar37.g * fVar23;
        local_78._8_4_ = auVar20._0_4_ * fVar23;
        local_78._12_4_ = auVar20._4_4_ * fVar23;
      }
      auVar36 = ZEXT1664(local_78);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
      auVar6._8_4_ = 0x3f000000;
      auVar6._0_8_ = 0x3f0000003f000000;
      auVar6._12_4_ = 0x3f000000;
      auVar16 = vaddps_avx512vl(auVar16,auVar6);
      uVar9 = *(ulong *)((this->super_FilmBase).filter.
                         super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                         .bits & 0xffffffffffff);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar9;
      auVar6 = vsubps_avx(auVar16,auVar27);
      auVar28._0_4_ = auVar16._0_4_ + (float)uVar9;
      auVar28._4_4_ = auVar16._4_4_ + (float)(uVar9 >> 0x20);
      auVar28._8_4_ = auVar16._8_4_ + 0.0;
      auVar28._12_4_ = auVar16._12_4_ + 0.0;
      auVar16 = vroundps_avx(auVar28,9);
      auVar27 = vroundps_avx(auVar6,9);
      auVar6 = vpcmpeqd_avx(auVar6,auVar6);
      auVar29._0_4_ = (int)auVar16._0_4_;
      auVar29._4_4_ = (int)auVar16._4_4_;
      auVar29._8_4_ = (int)auVar16._8_4_;
      auVar29._12_4_ = (int)auVar16._12_4_;
      auVar30._0_4_ = (int)auVar27._0_4_;
      auVar30._4_4_ = (int)auVar27._4_4_;
      auVar30._8_4_ = (int)auVar27._8_4_;
      auVar30._12_4_ = (int)auVar27._12_4_;
      auVar6 = vpsubd_avx(auVar29,auVar6);
      auVar16 = vpminsd_avx(auVar6,auVar30);
      auVar6 = vpmaxsd_avx(auVar30,auVar6);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = (this->super_FilmBase).pixelBounds.pMin.super_Tuple2<pbrt::Point2,_int>;
      local_68 = vpmaxsd_avx(auVar16,auVar33);
      uVar12 = local_68._4_4_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = (this->super_FilmBase).pixelBounds.pMax.super_Tuple2<pbrt::Point2,_int>;
      auVar6 = vpminsd_avx(auVar34,auVar6);
      uVar9 = vpcmpd_avx512vl(local_68,auVar6,5);
      local_ac = auVar6._4_4_;
      if ((int)auVar6._4_4_ < (int)uVar12) {
        local_ac = uVar12;
      }
      if ((uVar9 & 3) == 0) {
        uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar18),auVar17,1);
        bVar15 = (bool)((byte)uVar7 & 1);
        auVar32 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_98 = vmovshdup_avx(local_78);
        auVar31 = ZEXT1664(local_98);
        local_88._4_12_ = auVar22._0_12_;
        local_88._0_4_ =
             (uint)bVar15 * (int)(auVar35._0_4_ * fVar23) + (uint)!bVar15 * (int)auVar35._0_4_;
        auVar21 = ZEXT1664(local_88);
        uVar14 = CONCAT44((int)((ulong)unaff_R15 >> 0x20),local_68._0_4_);
        auVar35 = ZEXT1664(local_68);
        uVar9 = (ulong)uVar12 << 0x20 | uVar14;
        do {
          auVar25._8_8_ = 0;
          auVar25._0_8_ = p->super_Tuple2<pbrt::Point2,_float>;
          local_a8 = auVar35._0_16_;
          auVar17 = vcvtdq2ps_avx(local_a8);
          auVar17 = vsubps_avx(auVar25,auVar17);
          auVar8._8_4_ = 0xbf000000;
          auVar8._0_8_ = 0xbf000000bf000000;
          auVar8._12_4_ = 0xbf000000;
          auVar17 = vaddps_avx512vl(auVar17,auVar8);
          local_b8 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar17);
          uVar13 = (this->super_FilmBase).filter.
                   super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
                   .bits;
          uVar12 = (uint)(ushort)(uVar13 >> 0x30);
          auVar16 = auVar32._0_16_;
          if (uVar13 >> 0x30 < 3) {
            this_01 = (GaussianFilter *)(uVar13 & 0xffffffffffff);
            if (uVar12 == 2) {
              fVar18 = GaussianFilter::Evaluate(this_01,(Point2f *)&local_b8);
              goto LAB_003a24b0;
            }
            auVar27 = vandps_avx(auVar17,auVar16);
            if (auVar27._0_4_ <= (this_01->radius).super_Tuple2<pbrt::Vector2,_float>.x) {
              auVar17 = vmovshdup_avx(auVar17);
              auVar17 = vandps_avx(auVar17,auVar16);
              uVar7 = vcmpss_avx512f(auVar17,ZEXT416((uint)(this_01->radius).
                                                           super_Tuple2<pbrt::Vector2,_float>.y),2);
              fVar18 = (float)((uint)((byte)uVar7 & 1) * 0x3f800000);
              goto LAB_003a24d1;
            }
          }
          else {
            uVar12 = uVar12 - 2;
            if (uVar12 < 2) {
              this_02 = (MitchellFilter *)(uVar13 & 0xffffffffffff);
              local_b0 = MitchellFilter::Mitchell1D
                                   (this_02,auVar17._0_4_ /
                                            (this_02->radius).super_Tuple2<pbrt::Vector2,_float>.x);
              FVar19 = MitchellFilter::Mitchell1D
                                 (this_02,local_b8.y /
                                          (this_02->radius).super_Tuple2<pbrt::Vector2,_float>.y);
              fVar18 = FVar19 * local_b0;
            }
            else {
              if (uVar12 != 2) {
                auVar26._8_8_ = 0;
                auVar26._0_8_ =
                     (((LanczosSincFilter *)(uVar13 & 0xffffffffffff))->radius).
                     super_Tuple2<pbrt::Vector2,_float>;
                auVar17 = vandps_avx(auVar17,auVar16);
                auVar17 = vsubps_avx(auVar26,auVar17);
                auVar17 = vmaxps_avx(auVar17,_DAT_00601010);
                auVar16 = vmovshdup_avx(auVar17);
                fVar18 = auVar17._0_4_ * auVar16._0_4_;
                goto LAB_003a24d1;
              }
              fVar18 = LanczosSincFilter::Evaluate
                                 ((LanczosSincFilter *)(uVar13 & 0xffffffffffff),
                                  (Point2f *)&local_b8);
            }
LAB_003a24b0:
            auVar35 = ZEXT1664(local_a8);
            auVar32 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            auVar31 = ZEXT1664(local_98);
            auVar21 = ZEXT1664(local_88);
            auVar36 = ZEXT1664(local_78);
LAB_003a24d1:
            if ((fVar18 != 0.0) || (NAN(fVar18))) {
              iVar2 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
              iVar3 = (this->pixels).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
              iVar4 = (this->pixels).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
              lVar11 = 0;
              pPVar5 = (this->pixels).values;
              do {
                fVar23 = auVar36._0_4_;
                if (((int)lVar11 != 0) && (fVar23 = auVar31._0_4_, (int)lVar11 != 1)) {
                  fVar23 = auVar21._0_4_;
                }
                pAVar1 = pPVar5[(iVar3 - iVar2) * ((int)(uVar9 >> 0x20) - iVar4) +
                                ((int)uVar9 - iVar2)].splatRGB + lVar11;
                dVar24 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
                do {
                  LOCK();
                  dVar10 = (double)(pAVar1->bits).super___atomic_base<unsigned_long>._M_i;
                  bVar15 = dVar24 == dVar10;
                  if (bVar15) {
                    (pAVar1->bits).super___atomic_base<unsigned_long>._M_i =
                         (__int_type_conflict1)(dVar24 + (double)(fVar18 * fVar23));
                    dVar10 = dVar24;
                  }
                  UNLOCK();
                  dVar24 = dVar10;
                } while (!bVar15);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
            }
          }
          uVar12 = auVar35._0_4_ + 1;
          uVar13 = uVar9 & 0xffffffff00000000;
          uVar9 = (uVar13 | uVar14) + 0x100000000;
          if (uVar12 != auVar6._0_4_) {
            uVar9 = uVar13 + uVar12;
          }
          auVar35 = ZEXT864(uVar9);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = uVar9;
          uVar13 = vpcmpd_avx512vl(auVar17,local_68,4);
        } while (((uVar13 & 1) != 0) || (local_ac != (uint)(uVar9 >> 0x20)));
      }
      return;
    }
  }
  LogFatal<char_const(&)[13]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.cpp"
             ,0x286,"Check failed: %s",(char (*) [13])"!v.HasNaNs()");
}

Assistant:

void GBufferFilm::AddSplat(const Point2f &p, SampledSpectrum v,
                           const SampledWavelengths &lambda) {
    // NOTE: same code as RGBFilm::AddSplat()...
    CHECK(!v.HasNaNs());
    // First convert to sensor exposure, H, then to camera RGB
    SampledSpectrum H = v * sensor->ImagingRatio();
    RGB rgb = sensor->ToSensorRGB(H, lambda);
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    if (m > maxComponentValue)
        rgb *= maxComponentValue / m;

    Point2f pDiscrete = p + Vector2f(0.5, 0.5);
    Bounds2i splatBounds(Point2i(Floor(pDiscrete - filter.Radius())),
                         Point2i(Floor(pDiscrete + filter.Radius())) + Vector2i(1, 1));
    splatBounds = Intersect(splatBounds, pixelBounds);
    for (Point2i pi : splatBounds) {
        Float wt = filter.Evaluate(Point2f(p - pi - Vector2f(0.5, 0.5)));
        if (wt != 0) {
            Pixel &pixel = pixels[pi];
            for (int i = 0; i < 3; ++i)
                pixel.splatRGB[i].Add(wt * rgb[i]);
        }
    }
}